

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

tmbstr ParseAttribute(TidyDocImpl *doc,Bool *isempty,Node **asp,Node **php)

{
  Lexer *pLVar1;
  Lexer *pLVar2;
  uint c;
  uint uVar3;
  uint uVar4;
  tmbstr ptVar5;
  Node *pNVar6;
  uint uVar7;
  Lexer *lexer;
  StreamIn *in;
  uint *local_38;
  
  pLVar1 = doc->lexer;
  *asp = (Node *)0x0;
  *php = (Node *)0x0;
LAB_00149b3d:
  do {
    c = prvTidyReadChar(doc->docIn);
    uVar4 = c;
    if ((int)c < 0x2f) {
      uVar3 = 0x28a;
      if ((c == 0x22) || (c == 0x27)) {
LAB_00149b78:
        prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,uVar3);
        goto LAB_00149b3d;
      }
      if (c == 0xffffffff) {
        prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,0x283);
        prvTidyUngetChar(0xffffffff,doc->docIn);
        return (tmbstr)0x0;
      }
    }
    else if ((int)c < 0x3d) {
      if (c == 0x2f) {
        uVar3 = prvTidyReadChar(doc->docIn);
        if (uVar3 == 0x3e) {
          *isempty = yes;
          return (tmbstr)0x0;
        }
        prvTidyUngetChar(uVar3,doc->docIn);
        uVar3 = pLVar1->lexsize;
        goto LAB_00149cc7;
      }
      if (c == 0x3c) {
        uVar3 = prvTidyReadChar(doc->docIn);
        if (uVar3 == 0x3f) {
          pLVar1 = doc->lexer;
          pLVar1->txtstart = pLVar1->lexsize;
          uVar3 = prvTidyReadChar(doc->docIn);
          break;
        }
        if (uVar3 != 0x25) {
          prvTidyUngetChar(uVar3,doc->docIn);
          prvTidyUngetChar(0x3c,doc->docIn);
          prvTidyReportAttrError(doc,pLVar1->token,(AttVal *)0x0,0x289);
          return (tmbstr)0x0;
        }
        pLVar1 = doc->lexer;
        pLVar1->txtstart = pLVar1->lexsize;
        uVar3 = prvTidyReadChar(doc->docIn);
        goto joined_r0x00149c0a;
      }
    }
    else {
      if (c == 0x3d) {
        uVar3 = 0x288;
        goto LAB_00149b78;
      }
      if (c == 0x3e) {
        return (tmbstr)0x0;
      }
    }
    if ((0x7f < c) || ((lexmap[c] & 8) == 0)) goto LAB_00149baf;
  } while( true );
joined_r0x00149de4:
  if (uVar3 == 0xffffffff) {
LAB_00149f17:
    uVar4 = pLVar1->lexsize;
    pLVar1->txtend = uVar4;
    if (pLVar1->txtstart < uVar4) {
      pLVar2 = doc->lexer;
      pNVar6 = (Node *)(*pLVar2->allocator->vtbl->alloc)(pLVar2->allocator,0x68);
      pNVar6->parent = (Node *)0x0;
      pNVar6->prev = (Node *)0x0;
      pNVar6->next = (Node *)0x0;
      pNVar6->content = (Node *)0x0;
      pNVar6->last = (Node *)0x0;
      pNVar6->attributes = (AttVal *)0x0;
      pNVar6->was = (Dict *)0x0;
      pNVar6->tag = (Dict *)0x0;
      pNVar6->element = (tmbstr)0x0;
      pNVar6->start = 0;
      pNVar6->end = 0;
      pNVar6->type = RootNode;
      pNVar6->line = 0;
      pNVar6->column = 0;
      pNVar6->closed = no;
      pNVar6->implicit = no;
      pNVar6->linebreak = no;
      uVar3 = pLVar2->columns;
      pNVar6->line = pLVar2->lines;
      pNVar6->column = uVar3;
      pNVar6->type = PhpTag;
      uVar3 = pLVar2->txtend;
      pNVar6->start = pLVar2->txtstart;
      pNVar6->end = uVar3;
      uVar4 = pLVar1->txtend;
    }
    else {
      pNVar6 = (Node *)0x0;
    }
    pLVar1->txtstart = uVar4;
    *php = pNVar6;
    return (tmbstr)0x0;
  }
  prvTidyAddCharToLexer(pLVar1,uVar3);
  if (uVar3 == 0x3f) {
    uVar3 = prvTidyReadChar(doc->docIn);
    if (uVar3 == 0xffffffff) goto LAB_00149f17;
    prvTidyAddCharToLexer(pLVar1,uVar3);
    if (uVar3 == 0x3e) {
      pLVar1->lexsize = pLVar1->lexsize - 2;
      goto LAB_00149f17;
    }
  }
  uVar3 = prvTidyReadChar(doc->docIn);
  goto joined_r0x00149de4;
joined_r0x00149c0a:
  if (uVar3 == 0xffffffff) {
LAB_00149ea2:
    uVar4 = pLVar1->lexsize;
    pLVar1->txtend = uVar4;
    if (pLVar1->txtstart < uVar4) {
      pLVar2 = doc->lexer;
      pNVar6 = (Node *)(*pLVar2->allocator->vtbl->alloc)(pLVar2->allocator,0x68);
      pNVar6->parent = (Node *)0x0;
      pNVar6->prev = (Node *)0x0;
      pNVar6->next = (Node *)0x0;
      pNVar6->content = (Node *)0x0;
      pNVar6->last = (Node *)0x0;
      pNVar6->attributes = (AttVal *)0x0;
      pNVar6->was = (Dict *)0x0;
      pNVar6->tag = (Dict *)0x0;
      pNVar6->element = (tmbstr)0x0;
      pNVar6->start = 0;
      pNVar6->end = 0;
      pNVar6->type = RootNode;
      pNVar6->line = 0;
      pNVar6->column = 0;
      pNVar6->closed = no;
      pNVar6->implicit = no;
      pNVar6->linebreak = no;
      uVar3 = pLVar2->columns;
      pNVar6->line = pLVar2->lines;
      pNVar6->column = uVar3;
      pNVar6->type = AspTag;
      uVar3 = pLVar2->txtend;
      pNVar6->start = pLVar2->txtstart;
      pNVar6->end = uVar3;
      uVar4 = pLVar1->txtend;
    }
    else {
      pNVar6 = (Node *)0x0;
    }
    pLVar1->txtstart = uVar4;
    *asp = pNVar6;
    return (tmbstr)0x0;
  }
  prvTidyAddCharToLexer(pLVar1,uVar3);
  if (uVar3 == 0x25) {
    uVar3 = prvTidyReadChar(doc->docIn);
    if (uVar3 == 0xffffffff) goto LAB_00149ea2;
    prvTidyAddCharToLexer(pLVar1,uVar3);
    if (uVar3 == 0x3e) {
      pLVar1->lexsize = pLVar1->lexsize - 2;
      goto LAB_00149ea2;
    }
  }
  uVar3 = prvTidyReadChar(doc->docIn);
  goto joined_r0x00149c0a;
LAB_00149baf:
  uVar3 = pLVar1->lexsize;
  if (1 < c - 0x3d) {
LAB_00149cc7:
    local_38 = &pLVar1->lexsize;
    do {
      if ((uVar4 == 0x3c) || (uVar4 == 0xffffffff)) break;
      if ((c == 0x2d) && ((uVar4 == 0x27 || (uVar4 == 0x22)))) {
        *local_38 = *local_38 - 1;
        prvTidyUngetChar(uVar4,doc->docIn);
        goto LAB_00149d9a;
      }
      if (uVar4 < 0x80) {
        if ((lexmap[uVar4] & 8) != 0) goto LAB_00149d9a;
        if (uVar4 == 0x2f) {
          uVar7 = prvTidyReadChar(doc->docIn);
          in = doc->docIn;
          if (uVar7 == 0x3e) {
            uVar4 = 0x3e;
            goto LAB_00149d91;
          }
          prvTidyUngetChar(uVar7,in);
        }
      }
      c = uVar4;
      if ((((doc->config).value[0x54].v != 2) && (uVar4 < 0x80)) &&
         (*(int *)((doc->config).value + 0x67) == 0)) {
        c = uVar4 + (lexmap[uVar4] >> 1 & 0x20);
      }
      prvTidyAddCharToLexer(pLVar1,c);
      uVar4 = prvTidyReadChar(doc->docIn);
    } while (1 < uVar4 - 0x3d);
  }
  in = doc->docIn;
LAB_00149d91:
  prvTidyUngetChar(uVar4,in);
LAB_00149d9a:
  uVar7 = pLVar1->lexsize - uVar3;
  if ((int)uVar7 < 1) {
    ptVar5 = (tmbstr)0x0;
  }
  else {
    ptVar5 = prvTidytmbstrndup(doc->allocator,pLVar1->lexbuf + (int)uVar3,uVar7);
  }
  pLVar1->lexsize = uVar3;
  return ptVar5;
}

Assistant:

static tmbstr  ParseAttribute( TidyDocImpl* doc, Bool *isempty,
                              Node **asp, Node **php )
{
    Lexer* lexer = doc->lexer;
    int start, len = 0;
    tmbstr attr = NULL;
    uint c, lastc;

    *asp = NULL;  /* clear asp pointer */
    *php = NULL;  /* clear php pointer */

 /* skip white space before the attribute */

    for (;;)
    {
        c = TY_(ReadChar)( doc->docIn );


        if (c == '/')
        {
            c = TY_(ReadChar)( doc->docIn );

            if (c == '>')
            {
                *isempty = yes;
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            c = '/';
            break;
        }

        if (c == '>')
            return NULL;

        if (c =='<')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c == '%')
            {
                *asp = ParseAsp( doc );
                return NULL;
            }
            else if (c == '?')
            {
                *php = ParsePhp( doc );
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            TY_(UngetChar)('<', doc->docIn);
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
            return NULL;
        }

        if (c == '=')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_EQUALSIGN );
            continue;
        }

        if (c == '"' || c == '\'')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_QUOTEMARK );
            continue;
        }

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            return NULL;
        }


        if (!TY_(IsWhite)(c))
           break;
    }

    start = lexer->lexsize;
    lastc = c;

    for (;;)
    {
     /* but push back '=' for parseValue() */
        if (c == '=' || c == '>')
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (c == '<' || c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (lastc == '-' && (c == '"' || c == '\''))
        {
            lexer->lexsize--;
            --len;
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (TY_(IsWhite)(c))
            break;

        if (c == '/') /* Issue #395 - potential self closing tag */
        {
            c = TY_(ReadChar)(doc->docIn);  /* read next */
            if (c == '>')
            {
                /* got a self closing tag - put is back and continue... */
                TY_(UngetChar)(c, doc->docIn);
                break;
            }
            else
            {
                /* Not '/>' - put it back */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';  /* retore original char */
            }
        }

        /* what should be done about non-namechar characters? */
        /* currently these are incorporated into the attr name */

        if ( cfg(doc, TidyUpperCaseAttrs) != TidyUppercasePreserve )
        {
            if ( !cfgBool(doc, TidyXmlTags) && TY_(IsUpper)(c) )
                c = TY_(ToLower)(c);
        }

        TY_(AddCharToLexer)( lexer, c );
        lastc = c;
        c = TY_(ReadChar)(doc->docIn);
    }

    /* handle attribute names with multibyte chars */
    len = lexer->lexsize - start;
    attr = (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                      lexer->lexbuf+start, len) : NULL);
    lexer->lexsize = start;
    return attr;
}